

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endec_pair_tester.hxx
# Opt level: O2

void __thiscall
cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_aes_192_ctr>_>::
endec_pair_tester(endec_pair_tester<cryptox::symmetric_algorithm<&EVP_aes_192_ctr>_> *this)

{
  detail::make_random_vector(&this->key,0x20);
  detail::make_random_vector(&this->salt,0x20);
  detail::make_random_vector(&this->iv,0x20);
  evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_192_ctr>,&EVP_EncryptInit_ex,&EVP_EncryptUpdate,&EVP_EncryptFinal_ex>
  ::
  evp_cipher_context<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_192_ctr>,&EVP_EncryptInit_ex,&EVP_EncryptUpdate,&EVP_EncryptFinal_ex>
              *)&this->encryptor,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->iv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->iv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_192_ctr>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
  ::
  evp_cipher_context<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_192_ctr>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
              *)&this->decryptor,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->iv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->iv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  return;
}

Assistant:

endec_pair_tester()
		 : key(detail::make_random_vector()),
		   salt(detail::make_random_vector()),
		     iv(detail::make_random_vector()),
		  encryptor(key.begin(), key.end(), iv.begin(), iv.end()),
		  decryptor(key.begin(), key.end(), iv.begin(), iv.end()) {
		}